

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

void __thiscall TPZMatrix<long>::Transpose(TPZMatrix<long> *this,TPZMatrix<long> *T)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  long lVar3;
  undefined8 local_30;
  
  (*(T->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xd])
            (T,(this->super_TPZBaseMatrix).fCol,(this->super_TPZBaseMatrix).fRow);
  if (0 < (this->super_TPZBaseMatrix).fRow) {
    lVar3 = 0;
    do {
      if (0 < (this->super_TPZBaseMatrix).fCol) {
        lVar2 = 0;
        do {
          iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                            (this,lVar3,lVar2);
          local_30 = CONCAT44(extraout_var,iVar1);
          (*(T->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (T,lVar2,lVar3,&local_30);
          lVar2 = lVar2 + 1;
        } while (lVar2 < (this->super_TPZBaseMatrix).fCol);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < (this->super_TPZBaseMatrix).fRow);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::Transpose(TPZMatrix<TVar> *T) const {
	T->Resize( Cols(), Rows() );
	
	for ( int64_t r = 0; r < Rows(); r++ ) {
        for ( int64_t c = 0; c < Cols(); c++ ) {
            T->PutVal( c, r, GetVal( r, c ) );
        }
    }
}